

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_RSAPSS.c
# Opt level: O3

uint64_t *
Hacl_RSAPSS_new_rsapss_load_skey
          (uint32_t modBits,uint32_t eBits,uint32_t dBits,uint8_t *nb,uint8_t *eb,uint8_t *db)

{
  uint nBits;
  uint64_t *res;
  ulong uVar1;
  uint64_t *res_00;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  uint uVar6;
  uint64_t *res_01;
  uint uVar7;
  
  if ((eBits != 0 && 1 < modBits) &&
     (uVar7 = dBits - 1, uVar7 < 0xffffffc0 && (eBits < 0xffffffc1 && modBits < 0x7fffffc1))) {
    nBits = modBits - 1;
    uVar5 = nBits >> 6;
    uVar6 = eBits - 1 >> 6;
    res = (uint64_t *)calloc((ulong)((uVar7 >> 6) + uVar6 + uVar5 * 2 + 4),8);
    if (res != (uint64_t *)0x0) {
      uVar1 = (ulong)((uVar5 + 1) * 8);
      res_01 = (uint64_t *)((long)res + uVar1);
      res_00 = (uint64_t *)(uVar1 + (long)res_01);
      Hacl_Bignum_Convert_bn_from_bytes_be_uint64((nBits >> 3) + 1,nb,res);
      Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64(uVar5 + 1,nBits,res,res_01);
      Hacl_Bignum_Convert_bn_from_bytes_be_uint64((eBits - 1 >> 3) + 1,eb,res_00);
      uVar2 = check_modulus_u64(modBits,res);
      uVar3 = check_exponent_u64(eBits,res_00);
      Hacl_Bignum_Convert_bn_from_bytes_be_uint64((uVar7 >> 3) + 1,db,res + (uVar6 + 3 + uVar5 * 2))
      ;
      uVar4 = check_exponent_u64(dBits,res + (uVar6 + 3 + uVar5 * 2));
      if (((uVar3 & uVar2) == 0xffffffffffffffff) && (uVar4 == 0xffffffffffffffff)) {
        return res;
      }
      free(res);
    }
  }
  return (uint64_t *)0x0;
}

Assistant:

uint64_t
*Hacl_RSAPSS_new_rsapss_load_skey(
  uint32_t modBits,
  uint32_t eBits,
  uint32_t dBits,
  uint8_t *nb,
  uint8_t *eb,
  uint8_t *db
)
{
  bool ite0;
  if (1U < modBits && 0U < eBits)
  {
    uint32_t nLen = (modBits - 1U) / 64U + 1U;
    uint32_t eLen = (eBits - 1U) / 64U + 1U;
    ite0 = nLen <= 33554431U && eLen <= 67108863U && nLen + nLen <= 0xffffffffU - eLen;
  }
  else
  {
    ite0 = false;
  }
  bool ite;
  if (ite0 && 0U < dBits)
  {
    uint32_t nLen = (modBits - 1U) / 64U + 1U;
    uint32_t eLen = (eBits - 1U) / 64U + 1U;
    uint32_t dLen = (dBits - 1U) / 64U + 1U;
    ite = dLen <= 67108863U && 2U * nLen <= 0xffffffffU - eLen - dLen;
  }
  else
  {
    ite = false;
  }
  if (!ite)
  {
    return NULL;
  }
  uint32_t nLen = (modBits - 1U) / 64U + 1U;
  uint32_t eLen = (eBits - 1U) / 64U + 1U;
  uint32_t dLen = (dBits - 1U) / 64U + 1U;
  uint32_t skeyLen = nLen + nLen + eLen + dLen;
  KRML_CHECK_SIZE(sizeof (uint64_t), skeyLen);
  uint64_t *skey = (uint64_t *)KRML_HOST_CALLOC(skeyLen, sizeof (uint64_t));
  if (skey == NULL)
  {
    return skey;
  }
  uint64_t *skey1 = skey;
  uint64_t *skey2 = skey1;
  uint32_t dbLen = (dBits - 1U) / 8U + 1U;
  uint32_t nLen1 = (modBits - 1U) / 64U + 1U;
  uint32_t eLen1 = (eBits - 1U) / 64U + 1U;
  uint32_t pkeyLen = nLen1 + nLen1 + eLen1;
  uint64_t *pkey = skey2;
  uint64_t *d = skey2 + pkeyLen;
  uint32_t nbLen1 = (modBits - 1U) / 8U + 1U;
  uint32_t ebLen1 = (eBits - 1U) / 8U + 1U;
  uint32_t nLen2 = (modBits - 1U) / 64U + 1U;
  uint64_t *n = pkey;
  uint64_t *r2 = pkey + nLen2;
  uint64_t *e = pkey + nLen2 + nLen2;
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64(nbLen1, nb, n);
  Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64((modBits - 1U) / 64U + 1U, modBits - 1U, n, r2);
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64(ebLen1, eb, e);
  uint64_t m0 = check_modulus_u64(modBits, n);
  uint64_t m10 = check_exponent_u64(eBits, e);
  uint64_t m = m0 & m10;
  bool b = m == 0xFFFFFFFFFFFFFFFFULL;
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64(dbLen, db, d);
  uint64_t m1 = check_exponent_u64(dBits, d);
  bool b0 = b && m1 == 0xFFFFFFFFFFFFFFFFULL;
  if (b0)
  {
    return skey2;
  }
  KRML_HOST_FREE(skey2);
  return NULL;
}